

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
::uninitialized_move_n
          (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_true>_>
          *x,allocator_type *alloc)

{
  slot_type *psVar1;
  slot_type *psVar2;
  long lVar3;
  
  slot(x,j);
  psVar1 = slot(this,i);
  psVar2 = slot(x,j);
  for (lVar3 = 0; n << 3 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined8 *)((long)psVar2 + lVar3) = *(undefined8 *)((long)psVar1 + lVar3);
  }
  return;
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }